

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkInformation.cxx
# Opt level: O2

FeatureDescriptor * __thiscall
cmComputeLinkInformation::GetGroupFeature(cmComputeLinkInformation *this,string *feature)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmComputeLinkInformation::FeatureDescriptor,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmComputeLinkInformation::FeatureDescriptor>_>_>
  *this_00;
  cmMakefile *pcVar1;
  cmake *pcVar2;
  bool bVar3;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmComputeLinkInformation::FeatureDescriptor>_>
  _Var4;
  cmValue list;
  string *psVar5;
  string *psVar6;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmComputeLinkInformation::FeatureDescriptor>_>,_bool>
  pVar7;
  string local_1e0;
  vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  items;
  cmValue featureSupported;
  cmAlphaNum local_198;
  undefined1 local_168 [32];
  bool local_148;
  _Alloc_hider local_140;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_130;
  _Alloc_hider local_120;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_110;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d0;
  undefined1 local_c0 [16];
  string featureName;
  string local_90;
  string local_70;
  string local_50;
  
  this_00 = &this->GroupFeatureDescriptors;
  _Var4._M_node =
       (_Base_ptr)
       std::
       _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmComputeLinkInformation::FeatureDescriptor>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmComputeLinkInformation::FeatureDescriptor>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmComputeLinkInformation::FeatureDescriptor>_>_>
       ::find(&this_00->_M_t,feature);
  if ((_Rb_tree_header *)_Var4._M_node !=
      &(this->GroupFeatureDescriptors)._M_t._M_impl.super__Rb_tree_header) goto LAB_002ef59f;
  local_168._0_8_ = &DAT_00000006;
  local_168._8_8_ = "CMAKE_";
  local_198.View_._M_str = (this->LinkLanguage)._M_dataplus._M_p;
  local_198.View_._M_len = (this->LinkLanguage)._M_string_length;
  cmStrCat<char[19],std::__cxx11::string>
            (&featureName,(cmAlphaNum *)local_168,&local_198,(char (*) [19])0x5bf8eb,feature);
  pcVar1 = this->Makefile;
  local_168._0_8_ = featureName._M_string_length;
  local_168._8_8_ = featureName._M_dataplus._M_p;
  local_198.View_._M_len = 10;
  local_198.View_._M_str = (char *)((long)"CMAKE_CUDA_PIE_SUPPORTED" + 0xe);
  cmStrCat<>(&local_1e0,(cmAlphaNum *)local_168,&local_198);
  featureSupported = cmMakefile::GetDefinition(pcVar1,&local_1e0);
  std::__cxx11::string::~string((string *)&local_1e0);
  if (featureSupported.Value == (string *)0x0) {
    local_168._0_8_ = (element_type *)0x17;
    local_168._8_8_ = "CMAKE_LINK_GROUP_USING_";
    local_198.View_._M_str = (feature->_M_dataplus)._M_p;
    local_198.View_._M_len = feature->_M_string_length;
    cmStrCat<>(&local_1e0,(cmAlphaNum *)local_168,&local_198);
    std::__cxx11::string::operator=((string *)&featureName,(string *)&local_1e0);
    std::__cxx11::string::~string((string *)&local_1e0);
    pcVar1 = this->Makefile;
    local_168._0_8_ = featureName._M_string_length;
    local_168._8_8_ = featureName._M_dataplus._M_p;
    local_198.View_._M_len = 10;
    local_198.View_._M_str = (char *)((long)"CMAKE_CUDA_PIE_SUPPORTED" + 0xe);
    cmStrCat<>(&local_1e0,(cmAlphaNum *)local_168,&local_198);
    featureSupported = cmMakefile::GetDefinition(pcVar1,&local_1e0);
    std::__cxx11::string::~string((string *)&local_1e0);
  }
  psVar6 = &this->LinkLanguage;
  bVar3 = cmValue::IsOn(&featureSupported);
  if (bVar3) {
    list = cmMakefile::GetDefinition(this->Makefile,&featureName);
    if (list.Value == (string *)0x0) {
      pcVar2 = this->CMakeInstance;
      local_168._0_8_ = &DAT_00000009;
      local_168._8_8_ = "Feature \'";
      local_198.View_._M_str = (feature->_M_dataplus)._M_p;
      local_198.View_._M_len = feature->_M_string_length;
      psVar5 = cmGeneratorTarget::GetName_abi_cxx11_(this->Target);
      cmStrCat<char[75],std::__cxx11::string,char[28],std::__cxx11::string,char[17]>
                (&local_1e0,(cmAlphaNum *)local_168,&local_198,
                 (char (*) [75])
                 "\', specified through generator-expression \'$<LINK_GROUP>\' to link target \'",
                 psVar5,(char (*) [28])"\', is not defined for the \'",psVar6,
                 (char (*) [17])"\' link language.");
      cmGeneratorTarget::GetBacktrace((cmGeneratorTarget *)&items);
      cmake::IssueMessage(pcVar2,FATAL_ERROR,&local_1e0,(cmListFileBacktrace *)&items);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                 &items.
                  super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish);
      std::__cxx11::string::~string((string *)&local_1e0);
      memset((element_type *)(local_168 + 0x10),0,0x98);
      local_168._8_8_ = (cmMakefile *)0x0;
      local_148 = false;
      local_140._M_p = (pointer)&local_130;
      local_130._M_local_buf[0] = '\0';
      local_120._M_p = (pointer)&local_110;
      local_110._0_1_ = '\0';
      local_110._16_8_ = &local_f0;
      local_f0._M_local_buf[0] = '\0';
      local_e0._M_allocated_capacity = (size_type)&local_d0;
      local_d0._M_local_buf[0] = '\0';
      local_168._0_8_ = (element_type *)(local_168 + 0x10);
      pVar7 = std::
              _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>,std::_Select1st<std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>>>
              ::
              _M_emplace_unique<std::__cxx11::string_const&,cmComputeLinkInformation::FeatureDescriptor>
                        ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>,std::_Select1st<std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>>>
                          *)this_00,feature,(FeatureDescriptor *)local_168);
      _Var4 = pVar7.first._M_node;
      goto LAB_002ef429;
    }
    cmGeneratorTarget::GetBacktrace((cmGeneratorTarget *)local_168);
    cmExpandListWithBacktrace(&items,list.Value,(cmListFileBacktrace *)local_168,true);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_168 + 8));
    cmGeneratorTarget::ResolveLinkerWrapper(this->Target,&items,psVar6,true);
    if ((long)items.
              super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)items.
              super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start == 0x60) {
      std::__cxx11::string::string((string *)&local_50,(string *)feature);
      std::__cxx11::string::string
                ((string *)&local_70,
                 (string *)
                 items.
                 super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start);
      std::__cxx11::string::string
                ((string *)&local_90,
                 (string *)
                 (items.
                  super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + 1));
      GroupFeatureDescriptor::GroupFeatureDescriptor
                ((GroupFeatureDescriptor *)local_168,&local_50,&local_70,&local_90);
      pVar7 = std::
              _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>,std::_Select1st<std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>>>
              ::
              _M_emplace_unique<std::__cxx11::string_const&,cmComputeLinkInformation::GroupFeatureDescriptor>
                        ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>,std::_Select1st<std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>>>
                          *)this_00,feature,(GroupFeatureDescriptor *)local_168);
      _Var4 = pVar7.first._M_node;
      FeatureDescriptor::~FeatureDescriptor((FeatureDescriptor *)local_168);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_50);
    }
    else {
      pcVar2 = this->CMakeInstance;
      local_168._0_8_ = &DAT_00000009;
      local_168._8_8_ = "Feature \'";
      local_198.View_._M_str = (feature->_M_dataplus)._M_p;
      local_198.View_._M_len = feature->_M_string_length;
      psVar6 = cmGeneratorTarget::GetName_abi_cxx11_(this->Target);
      cmStrCat<char[27],std::__cxx11::string,char[79],std::__cxx11::string,char[3]>
                (&local_1e0,(cmAlphaNum *)local_168,&local_198,
                 (char (*) [27])"\', specified by variable \'",&featureName,
                 (char (*) [79])
                 "\', is malformed (wrong number of elements) and cannot be used to link target \'",
                 psVar6,(char (*) [3])0x594ef1);
      cmGeneratorTarget::GetBacktrace((cmGeneratorTarget *)local_c0);
      cmake::IssueMessage(pcVar2,FATAL_ERROR,&local_1e0,(cmListFileBacktrace *)local_c0);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_c0 + 8));
      std::__cxx11::string::~string((string *)&local_1e0);
      memset((element_type *)(local_168 + 0x10),0,0x98);
      local_168._8_8_ = (cmMakefile *)0x0;
      local_148 = false;
      local_140._M_p = (pointer)&local_130;
      local_130._M_local_buf[0] = '\0';
      local_120._M_p = (pointer)&local_110;
      local_110._0_1_ = '\0';
      local_110._16_8_ = &local_f0;
      local_f0._M_local_buf[0] = '\0';
      local_e0._M_allocated_capacity = (size_type)&local_d0;
      local_d0._M_local_buf[0] = '\0';
      local_168._0_8_ = (element_type *)(local_168 + 0x10);
      pVar7 = std::
              _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>,std::_Select1st<std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>>>
              ::
              _M_emplace_unique<std::__cxx11::string_const&,cmComputeLinkInformation::FeatureDescriptor>
                        ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>,std::_Select1st<std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>>>
                          *)this_00,feature,(FeatureDescriptor *)local_168);
      _Var4 = pVar7.first._M_node;
      FeatureDescriptor::~FeatureDescriptor((FeatureDescriptor *)local_168);
    }
    std::
    vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~vector(&items);
  }
  else {
    pcVar2 = this->CMakeInstance;
    local_168._0_8_ = &DAT_00000009;
    local_168._8_8_ = "Feature \'";
    local_198.View_._M_str = (feature->_M_dataplus)._M_p;
    local_198.View_._M_len = feature->_M_string_length;
    psVar5 = cmGeneratorTarget::GetName_abi_cxx11_(this->Target);
    cmStrCat<char[75],std::__cxx11::string,char[30],std::__cxx11::string,char[17]>
              (&local_1e0,(cmAlphaNum *)local_168,&local_198,
               (char (*) [75])
               "\', specified through generator-expression \'$<LINK_GROUP>\' to link target \'",
               psVar5,(char (*) [30])"\', is not supported for the \'",psVar6,
               (char (*) [17])"\' link language.");
    cmGeneratorTarget::GetBacktrace((cmGeneratorTarget *)&items);
    cmake::IssueMessage(pcVar2,FATAL_ERROR,&local_1e0,(cmListFileBacktrace *)&items);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               &items.
                super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish);
    std::__cxx11::string::~string((string *)&local_1e0);
    memset((element_type *)(local_168 + 0x10),0,0x98);
    local_168._8_8_ = (cmMakefile *)0x0;
    local_148 = false;
    local_140._M_p = (pointer)&local_130;
    local_130._M_local_buf[0] = '\0';
    local_120._M_p = (pointer)&local_110;
    local_110._0_1_ = '\0';
    local_110._16_8_ = &local_f0;
    local_f0._M_local_buf[0] = '\0';
    local_e0._M_allocated_capacity = (size_type)&local_d0;
    local_d0._M_local_buf[0] = '\0';
    local_168._0_8_ = (element_type *)(local_168 + 0x10);
    pVar7 = std::
            _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>,std::_Select1st<std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>>>
            ::
            _M_emplace_unique<std::__cxx11::string_const&,cmComputeLinkInformation::FeatureDescriptor>
                      ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>,std::_Select1st<std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>>>
                        *)this_00,feature,(FeatureDescriptor *)local_168);
    _Var4 = pVar7.first._M_node;
LAB_002ef429:
    FeatureDescriptor::~FeatureDescriptor((FeatureDescriptor *)local_168);
  }
  std::__cxx11::string::~string((string *)&featureName);
LAB_002ef59f:
  return (FeatureDescriptor *)(_Var4._M_node + 2);
}

Assistant:

cmComputeLinkInformation::FeatureDescriptor const&
cmComputeLinkInformation::GetGroupFeature(std::string const& feature)
{
  auto it = this->GroupFeatureDescriptors.find(feature);
  if (it != this->GroupFeatureDescriptors.end()) {
    return it->second;
  }

  auto featureName =
    cmStrCat("CMAKE_", this->LinkLanguage, "_LINK_GROUP_USING_", feature);
  cmValue featureSupported =
    this->Makefile->GetDefinition(cmStrCat(featureName, "_SUPPORTED"));
  if (!featureSupported) {
    // language specific variable is not defined, fallback to the more generic
    // one
    featureName = cmStrCat("CMAKE_LINK_GROUP_USING_", feature);
    featureSupported =
      this->Makefile->GetDefinition(cmStrCat(featureName, "_SUPPORTED"));
  }
  if (!featureSupported.IsOn()) {
    this->CMakeInstance->IssueMessage(
      MessageType::FATAL_ERROR,
      cmStrCat("Feature '", feature,
               "', specified through generator-expression '$<LINK_GROUP>' to "
               "link target '",
               this->Target->GetName(), "', is not supported for the '",
               this->LinkLanguage, "' link language."),
      this->Target->GetBacktrace());
    return this->GroupFeatureDescriptors.emplace(feature, FeatureDescriptor{})
      .first->second;
  }

  cmValue langFeature = this->Makefile->GetDefinition(featureName);
  if (!langFeature) {
    this->CMakeInstance->IssueMessage(
      MessageType::FATAL_ERROR,
      cmStrCat("Feature '", feature,
               "', specified through generator-expression '$<LINK_GROUP>' to "
               "link target '",
               this->Target->GetName(), "', is not defined for the '",
               this->LinkLanguage, "' link language."),
      this->Target->GetBacktrace());
    return this->GroupFeatureDescriptors.emplace(feature, FeatureDescriptor{})
      .first->second;
  }

  auto items =
    cmExpandListWithBacktrace(langFeature, this->Target->GetBacktrace(), true);

  // replace LINKER: pattern
  this->Target->ResolveLinkerWrapper(items, this->LinkLanguage, true);

  if (items.size() == 2) {
    return this->GroupFeatureDescriptors
      .emplace(
        feature,
        GroupFeatureDescriptor{ feature, items[0].Value, items[1].Value })
      .first->second;
  }

  this->CMakeInstance->IssueMessage(
    MessageType::FATAL_ERROR,
    cmStrCat("Feature '", feature, "', specified by variable '", featureName,
             "', is malformed (wrong number of elements) and cannot be used "
             "to link target '",
             this->Target->GetName(), "'."),
    this->Target->GetBacktrace());
  return this->GroupFeatureDescriptors.emplace(feature, FeatureDescriptor{})
    .first->second;
}